

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O1

void __thiscall brown::Simulator::renderLoop(Simulator *this,Tile *dd)

{
  Tile *this_00;
  uintptr_t uVar1;
  bool bVar2;
  App *this_01;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t *puVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  float fVar22;
  int mousx;
  int dmousy;
  int dmousx;
  int bstatus;
  int mousy;
  int local_64;
  App *local_60;
  float local_54;
  int local_50;
  int local_4c;
  Tile *local_48;
  Simulator *local_40;
  byte local_38 [4];
  int local_34;
  
  local_60 = this->app;
  uVar15 = this->BMPYRES;
  if (dd->y < this->BMPYRES) {
    uVar15 = dd->y;
  }
  uVar18 = (ulong)uVar15;
  if (0 < (int)uVar15) {
    this_00 = &this->drawing;
    local_48 = dd;
    local_40 = this;
    do {
      iVar17 = (int)uVar18;
      uVar18 = (long)iVar17 - 1;
      uVar15 = local_40->BMPXRES;
      if (local_48->x < local_40->BMPXRES) {
        uVar15 = local_48->x;
      }
      if (0 < (int)uVar15) {
        iVar19 = local_48->p;
        uVar1 = local_48->f;
        lVar21 = (ulong)uVar15 + 1;
        do {
          uVar15 = uVar15 - 1;
          puVar6 = Tile::getpix(this_00,uVar15,(int)uVar18);
          *(uint32_t *)((long)iVar19 * uVar18 + uVar1 + -8 + lVar21 * 4) = *puVar6;
          lVar21 = lVar21 + -1;
        } while (1 < lVar21);
      }
      dd = local_48;
      this = local_40;
    } while (1 < iVar17);
  }
  Tile::drawrectfill(dd,this->BMPXRES,0,dd->x,this->BMPYRES,0);
  Tile::drawrectfill(dd,0,this->BMPYRES,dd->x,dd->y,0);
  uVar3 = 0xff0000;
  if (this->odown != false) {
    uVar3 = 0xff00;
  }
  Tile::drawcirc(dd,(this->BMPXRES >> 1) + (this->acur[0] >> 6),
                 (this->BMPYRES >> 1) + (this->acur[1] >> 6),0x14,uVar3);
  sVar12 = this->fifn;
  Tile::print6x8(dd,0,0,0xffffff,0,"%.2f sec, fifn=%d",(double)this->pclk / (double)this->CLKFRQ,
                 sVar12);
  this_01 = local_60;
  pcVar7 = App::getKeyStatus(local_60);
  App::getMouseStatus(this_01,&local_64,&local_34,&local_4c,&local_50,(int *)local_38);
  renderLoop::otim = renderLoop::tim;
  uVar3 = App::getTime(this_01);
  renderLoop::tim = (double)uVar3 * 0.001;
  lVar21 = this->zoom;
  lVar8 = (long)((double)this->xoff +
                (double)(((long)pcVar7[0xcd] - (long)pcVar7[0xcb]) * lVar21 * 0x200) *
                (renderLoop::tim - renderLoop::otim));
  this->xoff = lVar8;
  if ((local_38[0] & 2) != 0) {
    lVar8 = local_4c * lVar21 + lVar8;
    this->xoff = lVar8;
    lVar13 = (local_50 * lVar21) / 100 + lVar21;
    iVar17 = 100;
    if (100 < lVar13) {
      iVar17 = (int)lVar13;
    }
    renderLoop::i = 10000000;
    if (lVar13 < 10000000) {
      renderLoop::i = iVar17;
    }
    lVar13 = (long)renderLoop::i;
    this->xoff = (long)local_64 * (lVar21 - lVar13) + lVar8;
    this->zoom = lVar13;
  }
  uVar15 = this->fault;
  if (uVar15 != 0) {
    iVar17 = (int)((this->faultclk - this->xoff) / this->zoom);
    if ((uVar15 & 0xfffffffe) == 2) {
      sVar12 = CONCAT44((int)(sVar12 >> 0x20),uVar15) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar17,0x25d,0xff8080,0,"fault: %c div by 0",sVar12);
    }
    if ((this->fault & 0xfffffffeU) == 4) {
      sVar12 = CONCAT44((int)(sVar12 >> 0x20),this->fault) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar17,0x25d,0xff8080,0,"fault: %c dir change at hi veloc",sVar12);
    }
    if ((this->fault & 0xfffffffeU) == 6) {
      sVar12 = CONCAT44((int)(sVar12 >> 0x20),this->fault) & 0xffffffff00000001 | 0x78;
      Tile::print6x8(dd,iVar17,0x25d,0xff8080,0,"fault: %c veloc too high",sVar12);
    }
    if ((this->fault & 0xfffffffeU) == 8) {
      sVar12 = CONCAT44((int)(sVar12 >> 0x20),this->fault) | 0x78;
      Tile::print6x8(dd,iVar17,0x25d,0xff8080,0,"fault: %c accel too high",sVar12);
    }
    Tile::drawline(dd,(float)iVar17,615.0,(float)iVar17,815.0,0xff8080);
  }
  lVar21 = this->xoff;
  lVar8 = this->zoom;
  lVar13 = this->fifclk[this->fifn - 1];
  renderLoop::i = 0;
  do {
    Tile::drawrectfill(dd,-(int)(lVar21 / lVar8),renderLoop::i * 0x28 + 0x267,
                       (int)((lVar13 - lVar21) / lVar8),renderLoop::i * 0x28 + 0x285,0x404040);
    bVar2 = renderLoop::i < 4;
    renderLoop::i = renderLoop::i + 1;
  } while (bVar2);
  renderLoop::dpx = -1;
  renderLoop::dpy = -1;
  uVar18 = 0;
  renderLoop::rzoom =
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000000)) / SEXT816(this->zoom),0) << 2;
  renderLoop::i = 0;
  if (this->fifn != 0) {
    uVar14 = 0;
    do {
      uVar20 = (this->fifclk[uVar14] - this->xoff) * renderLoop::rzoom;
      iVar17 = (int)uVar18;
      if (-1 < (long)uVar20) {
        uVar18 = uVar20 >> 0x20;
        iVar19 = (int)(uVar20 >> 0x20);
        if ((renderLoop::dpx < iVar19) && ((this->fifbit[uVar14] & 1U) != 0)) {
          renderLoop::dpx = iVar19;
          Tile::drawline(dd,(float)iVar19,615.0,(float)iVar19,645.0,0xffffff);
        }
        if ((renderLoop::dpy < iVar19) && ((this->fifbit[renderLoop::i] & 2U) != 0)) {
          renderLoop::dpy = iVar19;
          Tile::drawline(dd,(float)iVar19,695.0,(float)iVar19,725.0,0xffffff);
        }
        if (0 < (long)renderLoop::i) {
          local_54 = (float)iVar17;
          fVar22 = (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 2 & 1) * -0x1e +
                               0x2ad);
          local_60 = (App *)CONCAT44(local_60._4_4_,(float)iVar19);
          Tile::drawline(dd,local_54,fVar22,(float)iVar19,fVar22,0xffffff);
          Tile::drawline(dd,local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 2 & 1) *
                                      -0x1e + 0x2ad),local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[renderLoop::i] >> 2 & 1) * -0x1e + 0x2ad),
                         0xffffff);
          fVar22 = (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 3 & 1) * -0x1e +
                               0x2fd);
          Tile::drawline(dd,local_54,fVar22,local_60._0_4_,fVar22,0xffffff);
          Tile::drawline(dd,local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 3 & 1) *
                                      -0x1e + 0x2fd),local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[renderLoop::i] >> 3 & 1) * -0x1e + 0x2fd),
                         0xffffff);
          fVar22 = (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 4 & 1) * -0x1e +
                               0x325);
          Tile::drawline(dd,local_54,fVar22,local_60._0_4_,fVar22,0xffffff);
          Tile::drawline(dd,local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[(long)renderLoop::i + -1] >> 4 & 1) *
                                      -0x1e + 0x325),local_60._0_4_,
                         (float)(int)(((byte)this->fifbit[renderLoop::i] >> 4 & 1) * -0x1e + 0x325),
                         0xffffff);
        }
        if (dd->x <= iVar19) break;
      }
      uVar14 = (long)renderLoop::i + 1;
      renderLoop::i = (int)uVar14;
    } while (uVar14 < this->fifn);
  }
  sVar11 = this->fifn;
  if (sVar11 == 0) {
    sVar11 = 0;
  }
  else {
    sVar9 = 0;
    do {
      if ((long)local_64 * this->zoom + this->xoff <= this->fifclk[sVar9]) {
        renderLoop::i = (int)sVar9;
        uVar3 = 0xff00;
        if ((this->fifbit[sVar9] & 0x10U) == 0) {
          uVar3 = 0xff0000;
        }
        Tile::drawcirc(dd,(this->BMPXRES >> 1) + (this->fifcurx[sVar9] >> 6),
                       (this->BMPYRES >> 1) + (this->fifcury[sVar9] >> 6),5,uVar3);
        uVar18 = (ulong)renderLoop::i;
        uVar15 = 1;
        if (renderLoop::i < 1) {
          uVar15 = renderLoop::i;
        }
        uVar4 = renderLoop::i;
        uVar16 = renderLoop::i;
        goto LAB_001051f3;
      }
      sVar9 = sVar9 + 1;
    } while (sVar11 != sVar9);
  }
  renderLoop::i = (int)sVar11;
  goto LAB_00105451;
  while (uVar5 = uVar4 - 1, uVar10 = uVar4, uVar4 = uVar5, (this->fifbit[uVar16] & 1U) == 0) {
LAB_001051f3:
    uVar16 = uVar16 - 1;
    uVar10 = uVar15;
    uVar5 = uVar15 - 1;
    if ((int)uVar4 < 2) break;
  }
  uVar14 = this->fifn - 1;
  if (uVar18 < uVar14) {
    do {
      if ((this->fifbit[uVar18] & 1U) != 0) break;
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar14);
  }
  if (0 < (int)uVar10) {
    Tile::drawline(dd,(float)((this->fifclk[uVar5] - this->xoff) / this->zoom),628.0,
                   (float)((this->fifclk[uVar18] - this->xoff) / this->zoom),628.0,0x808080);
    sVar12 = this->fifclk[uVar18] - this->fifclk[uVar5];
    Tile::print6x8(dd,local_64 + 2,0x26c,0xffffff,0,"%d clk",sVar12);
    Tile::print6x8(dd,local_64 + 2,0x276,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[uVar18] - this->fifclk[uVar5]));
  }
  uVar18 = (ulong)renderLoop::i;
  uVar15 = 1;
  if (renderLoop::i < 1) {
    uVar15 = renderLoop::i;
  }
  uVar4 = renderLoop::i;
  uVar16 = renderLoop::i;
  do {
    uVar16 = uVar16 - 1;
    uVar10 = uVar15;
    uVar5 = uVar15 - 1;
    if ((int)uVar4 < 2) break;
    uVar5 = uVar4 - 1;
    uVar10 = uVar4;
    uVar4 = uVar5;
  } while ((this->fifbit[uVar16] & 2U) == 0);
  uVar14 = this->fifn - 1;
  if (uVar18 < uVar14) {
    do {
      if ((this->fifbit[uVar18] & 2U) != 0) break;
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar14);
  }
  if (0 < (int)uVar10) {
    Tile::drawline(dd,(float)((this->fifclk[uVar5] - this->xoff) / this->zoom),708.0,
                   (float)((this->fifclk[uVar18] - this->xoff) / this->zoom),708.0,0x808080);
    sVar12 = this->fifclk[uVar18] - this->fifclk[uVar5];
    Tile::print6x8(dd,local_64 + 2,700,0xffffff,0,"%d clk",sVar12);
    Tile::print6x8(dd,local_64 + 2,0x2c6,0xffffff,0,"(%.1f Hz)",
                   (double)this->CLKFRQ / (double)(this->fifclk[uVar18] - this->fifclk[uVar5]));
  }
LAB_00105451:
  Tile::drawline(dd,(float)local_64,615.0,(float)local_64,815.0,0x406080);
  Tile::print6x8(dd,local_64,0x25f,0xffffff,0,"%.6f sec",
                 (double)((long)local_64 * this->zoom + this->xoff) / (double)this->CLKFRQ,sVar12);
  Tile::print6x8(dd,5,0x274,0xffffff,0,"X Pulse:");
  Tile::print6x8(dd,5,0x29c,0xffffff,0,"X Dir:");
  Tile::print6x8(dd,5,0x2c4,0xffffff,0,"Y Pulse:");
  Tile::print6x8(dd,5,0x2ec,0xffffff,0,"Y Dir:");
  Tile::print6x8(dd,5,0x314,0xffffff,0,"Pen Down:");
  return;
}

Assistant:

void Simulator::renderLoop(Tile& dd) {
    App& app = *this->app;

    /* Copy drawing to texture */
    for(int y = min(dd.gety(),BMPYRES)-1; y >= 0; y--) {
        uint32_t* wptr = reinterpret_cast<uint32_t*>(dd.getp()*y + dd.getf());
        for(int x = min(dd.getx(),BMPXRES)-1; x >= 0; x--) {
            wptr[x] = drawing.getpix(x, y);
        }
    }

    /* Fill in the blank */
    dd.drawrectfill(BMPXRES, 0, dd.getx(), BMPYRES, BACKGROUND_COLOR);
    dd.drawrectfill(0, BMPYRES, dd.getx(), dd.gety(), BACKGROUND_COLOR);

    /* Draw pen location */
    if (!odown) {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, UP_LOC_COLOR);
    } else {
        dd.drawcirc((acur[0]>>6)+(BMPXRES>>1), (acur[1]>>6)+(BMPYRES>>1), 20, DOWN_LOC_COLOR);
    }

    /* Show timing info */
    dd.print6x8(0,0,0xffffff,BACKGROUND_COLOR,"%.2f sec, fifn=%d",(double)pclk/CLKFRQ,fifn);

#if ENABLE_SCOPE
    /* Scope, timing plot */
    static int64_t rzoom;
    static double tim = 0.0, otim, dtim;
    static int i, dpx, dpy;

    // Get app status
    const char* keystatus = app.getKeyStatus();
    int mousx, mousy, dmousx, dmousy, bstatus;
    app.getMouseStatus(mousx, mousy, dmousx, dmousy, bstatus);

    // Pan left/right with arrow keys
    otim = tim;
    tim = static_cast<double>(app.getTime())*.001;
    dtim = tim-otim;
    xoff += (keystatus[0xcd]-keystatus[0xcb])*zoom*512*dtim;

    // Zoom and pan with mouse
    if (bstatus & 1<<1) { // right mouse botton down
        // pan
        xoff += dmousx * zoom;
        // zoom
        i = min(max(zoom+(zoom*dmousy)/100,100),10000000);
        xoff += (zoom-i)*mousx;
        zoom = i;
    }

    // Error message
    if (fault) {
        int x = (faultclk-xoff)/zoom;
        if ((fault>>1) == 1) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c div by 0",(fault&1)+'x');
        if ((fault>>1) == 2) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c dir change at hi veloc",(fault&1)+'x');
        if ((fault>>1) == 3) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c veloc too high",(fault&1)+'x');
        if ((fault>>1) == 4) dd.print6x8(x,YOFF-10,0xff8080,FONT_B_COLOR,"fault: %c accel too high",(fault&1)+'x');
        dd.drawline(x,YOFF,x,YOFF+200,0xff8080);
    }

    // Scope background
    int ox = (0-xoff)/zoom;
    int x  = (fifclk[fifn-1]-xoff)/zoom;
    for(i=0;i<5;i++) {
         dd.drawrectfill(ox,YOFF+i*40,x,YOFF+30+i*40,0x404040);
    }
    ox = 0; dpx = -1; dpy = -1;
    rzoom = (((1<<30)/zoom)<<2);

    // Scope data
     for(i=0;i<fifn;i++)
     {
         x = (((fifclk[i]-xoff)*rzoom)>>32); if (x < 0) continue;
         if ((x > dpx) && (fifbit[i]&1)) { dpx = x; dd.drawline(x,YOFF   ,x,YOFF+ 30,0xffffff); }
         if ((x > dpy) && (fifbit[i]&2)) { dpy = x; dd.drawline(x,YOFF+80,x,YOFF+110,0xffffff); }
         if (i > 0)
         {
             dd.drawline(ox,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i-1]>>2)&1)*-30+YOFF+70,0xffffff);
             dd.drawline(x,((fifbit[i-1]>>2)&1)*-30+YOFF+ 70,x,((fifbit[i  ]>>2)&1)*-30+YOFF+70,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>3)&1)*-30+YOFF+150,x,((fifbit[i  ]>>3)&1)*-30+YOFF+150,0xffffff);

             dd.drawline(ox,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,0xffffff);
             dd.drawline( x,((fifbit[i-1]>>4)&1)*-30+YOFF+190,x,((fifbit[i  ]>>4)&1)*-30+YOFF+190,0xffffff);
         }
         ox = x; if (x >= dd.getx()) break;
     }

    // Scope annotation
     for(i=0;i<fifn;i++)
     {
         if (fifclk[i] >= mousx*zoom + xoff)
         {
             int i0, i1;
             dd.drawcirc((fifcurx[i]>>6)+(BMPXRES>>1),(fifcury[i]>>6)+(BMPYRES>>1),5,
                (fifbit[i] & (1<<4))? DOWN_LOC_COLOR : UP_LOC_COLOR);

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&1) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&1) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+13,(fifclk[i1]-xoff)/zoom,YOFF+13,0x808080);
                 dd.print6x8(mousx+2,YOFF+ 5,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+15,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             for(i0=i-1;i0> 0    ;i0--) if (fifbit[i0]&2) break;
             for(i1=i  ;i1<fifn-1;i1++) if (fifbit[i1]&2) break;
             if (i0 >= 0)
             {
                 dd.drawline((fifclk[i0]-xoff)/zoom,YOFF+93,(fifclk[i1]-xoff)/zoom,YOFF+93,0x808080);
                 dd.print6x8(mousx+2,YOFF+85,FONT_F_COLOR,FONT_B_COLOR,"%d clk",fifclk[i1]-fifclk[i0]);
                 dd.print6x8(mousx+2,YOFF+95,FONT_F_COLOR,FONT_B_COLOR,"(%.1f Hz)",CLKFRQ/(double)(fifclk[i1]-fifclk[i0]));
             }

             break;
         }
    }

    // Scope time cursor
    dd.drawline(mousx,YOFF,mousx,YOFF+200,0x406080);
    dd.print6x8(mousx,YOFF - 8,FONT_F_COLOR,FONT_B_COLOR,"%.6f sec",(double)(mousx*zoom + xoff)/CLKFRQ);

    // Scope captions
    dd.print6x8(5, YOFF+ 13, FONT_F_COLOR, FONT_B_COLOR, "X Pulse:");
    dd.print6x8(5, YOFF+ 53, FONT_F_COLOR, FONT_B_COLOR, "X Dir:");
    dd.print6x8(5, YOFF+ 93, FONT_F_COLOR, FONT_B_COLOR, "Y Pulse:");
    dd.print6x8(5, YOFF+133, FONT_F_COLOR, FONT_B_COLOR, "Y Dir:");
    dd.print6x8(5, YOFF+173, FONT_F_COLOR, FONT_B_COLOR, "Pen Down:");
#endif // ENABLE_SCOPE
}